

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iqueuehead.cpp
# Opt level: O0

int main(void)

{
  void *pvVar1;
  undefined8 *puVar2;
  SEG *myseg;
  int i;
  mypcb *mypb;
  
  pvVar1 = malloc(0x10);
  *(void **)pvVar1 = pvVar1;
  *(void **)((long)pvVar1 + 8) = pvVar1;
  for (myseg._4_4_ = 0; myseg._4_4_ < 10; myseg._4_4_ = myseg._4_4_ + 1) {
    puVar2 = (undefined8 *)malloc(0x18);
    *(int *)(puVar2 + 2) = myseg._4_4_;
    *puVar2 = puVar2;
    puVar2[1] = puVar2;
    puVar2[1] = *(undefined8 *)((long)pvVar1 + 8);
    *puVar2 = pvVar1;
    **(undefined8 **)((long)pvVar1 + 8) = puVar2;
    *(undefined8 **)((long)pvVar1 + 8) = puVar2;
  }
  return 0;
}

Assistant:

int main()
{
    mypcb *mypb = (mypcb*)malloc(sizeof(struct MYPCB));
    iqueue_init(&mypb->snd_queue);
    for(int i = 0;i<10;i++)
    {
        SEG *myseg = (struct SEG*)malloc(sizeof(struct SEG));
        myseg->id = i;
        iqueue_init(&myseg->node);
        iqueue_add_tail(&myseg->node, &mypb->snd_queue);
    }
    return 0;
}